

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O1

int SUNLinSolSpace(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  _func_int_SUNLinearSolver_long_ptr_long_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  UNRECOVERED_JUMPTABLE = S->ops->space;
  if (UNRECOVERED_JUMPTABLE != (_func_int_SUNLinearSolver_long_ptr_long_ptr *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(S,lenrwLS,leniwLS);
    return iVar1;
  }
  *lenrwLS = 0;
  *leniwLS = 0;
  return 0;
}

Assistant:

int SUNLinSolSpace(SUNLinearSolver S, long int *lenrwLS,
                   long int *leniwLS)
{
  if (S->ops->space)
    return ((int) S->ops->space(S, lenrwLS, leniwLS));
  else {
    *lenrwLS = 0;
    *leniwLS = 0;
    return SUNLS_SUCCESS;
  }
}